

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O3

bool __thiscall
lzham::lzcompressor::state::encode_eob(state *this,symbol_codec *codec,search_accelerator *dict)

{
  bool bVar1;
  uint uVar2;
  
  if (dict->m_cur_dict_size == 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = (uint)((dict->m_dict).m_p[dict->m_lookahead_pos - 1 & dict->m_max_dict_size_mask] >> 2);
  }
  bVar1 = symbol_codec::encode
                    (codec,1,(adaptive_bit_model *)
                             ((long)(&this->super_state_base + 1) +
                             (ulong)((this->super_state_base).m_cur_state << 6 | uVar2) * 2 + 4),
                     true);
  if (bVar1) {
    bVar1 = symbol_codec::encode
                      (codec,0,(adaptive_bit_model *)
                               ((long)this->m_lit_table +
                               (ulong)(this->super_state_base).m_cur_state * 2 + -0x7c),true);
    if (bVar1) {
      bVar1 = symbol_codec::encode(codec,0,&this->m_main_table);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool lzcompressor::state::encode_eob(symbol_codec& codec, const search_accelerator& dict)
   {
#ifdef LZHAM_LZDEBUG
      if (!codec.encode_bits(CLZBase::cLZHAMDebugSyncMarkerValue, CLZBase::cLZHAMDebugSyncMarkerBits)) return false;
      if (!codec.encode_bits(1, 1)) return false;
      if (!codec.encode_bits(0, 9)) return false;
      if (!codec.encode_bits(m_cur_state, 4)) return false;
#endif

      uint match_pred = dict.get_cur_dict_size() ? dict.get_char(-1) : 0;
      uint is_match_model_index = LZHAM_COMPUTE_IS_MATCH_MODEL_INDEX(match_pred, m_cur_state);
      if (!codec.encode(1, m_is_match_model[is_match_model_index])) return false;

      // full match
      if (!codec.encode(0, m_is_rep_model[m_cur_state])) return false;

      return codec.encode(CLZBase::cLZXSpecialCodeEndOfBlockCode, m_main_table);
   }